

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

bool __thiscall wasm::StackIROptimizer::isControlFlowBarrier(StackIROptimizer *this,StackInst *inst)

{
  Op OVar1;
  StackInst *inst_local;
  StackIROptimizer *this_local;
  
  OVar1 = inst->op;
  if ((((OVar1 == BlockEnd) || (OVar1 - IfElse < 2)) || (OVar1 == LoopEnd)) ||
     ((OVar1 - Catch < 4 || (OVar1 == TryTableEnd)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StackIROptimizer::isControlFlowBarrier(StackInst* inst) {
  switch (inst->op) {
    case StackInst::BlockEnd:
    case StackInst::IfElse:
    case StackInst::IfEnd:
    case StackInst::LoopEnd:
    case StackInst::Catch:
    case StackInst::CatchAll:
    case StackInst::Delegate:
    case StackInst::TryEnd:
    case StackInst::TryTableEnd: {
      return true;
    }
    default: {
      return false;
    }
  }
}